

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOdc.c
# Opt level: O2

int Abc_NtkDontCareTransfer(Odc_Man_t *p)

{
  ushort iFan1;
  Odc_Lit_t OVar1;
  Odc_Lit_t iFan1_00;
  Abc_Obj_t *pAVar2;
  void *pvVar3;
  int iVar4;
  
  Abc_NtkIncrementTravId(p->pNode->pNtk);
  for (iVar4 = 0; iVar4 < p->vLeaves->nSize; iVar4 = iVar4 + 1) {
    pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(p->vLeaves,iVar4);
    OVar1 = Odc_Var(p,iVar4);
    (pAVar2->field_6).pTemp = (void *)((long)((ulong)OVar1 * 0x1000100000000) >> 0x20);
    Abc_NodeSetTravIdCurrent(pAVar2);
  }
  for (iVar4 = 0; iVar4 < p->vBranches->nSize; iVar4 = iVar4 + 1) {
    pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(p->vBranches,iVar4);
    OVar1 = Odc_Var(p,p->nVarsMax + iVar4);
    (pAVar2->field_6).pTemp = (void *)((long)((ulong)OVar1 * 0x1000100000000) >> 0x20);
    Abc_NodeSetTravIdCurrent(pAVar2);
  }
  p->iRoot = 1;
  for (iVar4 = 0; iVar4 < p->vRoots->nSize; iVar4 = iVar4 + 1) {
    pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(p->vRoots,iVar4);
    pvVar3 = Abc_NtkDontCareTransfer_rec(p,pAVar2,p->pNode);
    iFan1 = (ushort)((ulong)pvVar3 >> 0x10);
    OVar1 = Odc_And(p,(Odc_Lit_t)pvVar3,iFan1 ^ 1);
    iFan1_00 = Odc_And(p,(Odc_Lit_t)pvVar3 ^ 1,iFan1);
    OVar1 = Odc_Or(p,OVar1,iFan1_00);
    OVar1 = Odc_Or(p,p->iRoot,OVar1);
    p->iRoot = OVar1;
  }
  return 1;
}

Assistant:

int Abc_NtkDontCareTransfer( Odc_Man_t * p )
{
    Abc_Obj_t * pObj;
    Odc_Lit_t uRes0, uRes1;
    Odc_Lit_t uLit;
    unsigned uData;
    int i;
    Abc_NtkIncrementTravId( p->pNode->pNtk );
    // set elementary variables at the leaves 
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vLeaves, pObj, i )
    {
        uLit = Odc_Var( p, i );
        pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)((uLit << 16) | uLit);
        Abc_NodeSetTravIdCurrent(pObj);
    }
    // set elementary variables at the branched 
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vBranches, pObj, i )
    {
        uLit = Odc_Var( p, i+p->nVarsMax );
        pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)((uLit << 16) | uLit);
        Abc_NodeSetTravIdCurrent(pObj);
    }
    // compute the AIG for the window
    p->iRoot = Odc_Const0();
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vRoots, pObj, i )
    {
        uData = (unsigned)(ABC_PTRUINT_T)Abc_NtkDontCareTransfer_rec( p, pObj, p->pNode );
        // get the cofactors
        uRes0 = uData & 0xffff;
        uRes1 = uData >> 16;
        // compute the miter
//        assert( uRes0 != uRes1 ); // may be false if the node is redundant w.r.t. this root
        uLit = Odc_Xor( p, uRes0, uRes1 );
        p->iRoot = Odc_Or( p, p->iRoot, uLit );
    }
    return 1;
}